

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O3

bool __thiscall luna::Table::EraseArrayValue(Table *this,size_t index)

{
  vector<luna::Value,_std::allocator<luna::Value>_> *pvVar1;
  bool bVar2;
  ulong uVar3;
  pointer pVVar4;
  pointer __src;
  
  if (index != 0) {
    pvVar1 = (this->array_)._M_t.
             super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
             .super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>
             ._M_head_impl;
    if (pvVar1 == (vector<luna::Value,_std::allocator<luna::Value>_> *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (long)*(pointer *)
                     ((long)&(pvVar1->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>)
                             ._M_impl + 8) -
              *(long *)&(pvVar1->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                        _M_impl >> 4;
    }
    if (uVar3 < index) {
      bVar2 = false;
    }
    else {
      __src = (pointer)(index * 0x10 +
                       *(long *)&(pvVar1->
                                 super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                                 _M_impl);
      pVVar4 = *(pointer *)
                ((long)&(pvVar1->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                        _M_impl + 8);
      if (__src != pVVar4) {
        memmove(__src + -1,__src,(long)pVVar4 - (long)__src);
        pVVar4 = *(pointer *)
                  ((long)&(pvVar1->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                          _M_impl + 8);
      }
      *(pointer *)
       ((long)&(pvVar1->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>)._M_impl + 8)
           = pVVar4 + -1;
      bVar2 = true;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool Table::EraseArrayValue(std::size_t index)
    {
        if (index < 1 || index > ArraySize())
            return false;

        auto it = array_->begin();
        std::advance(it, index - 1);
        array_->erase(it);
        return true;
    }